

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall
midi_container::get_meta_data(midi_container *this,unsigned_long subsong,midi_meta_data *p_out)

{
  long lVar1;
  bool bVar2;
  uint8_t uVar3;
  bool bVar4;
  unsigned_long p_subsong;
  long lVar5;
  unsigned_long uVar6;
  pointer puVar7;
  char *p_value;
  pointer pmVar8;
  ulong uVar9;
  midi_event *this_00;
  uint uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string convert;
  midi_meta_data_item local_a0;
  char temp [32];
  
  convert._M_dataplus._M_p = (pointer)&convert.field_2;
  convert._M_string_length = 0;
  convert.field_2._M_local_buf[0] = '\0';
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  bVar2 = false;
  bVar4 = false;
  do {
    pmVar8 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pmVar8) / 0x18) <= uVar9) {
      if ((bVar4) && (!bVar2)) {
        midi_meta_data_item::midi_meta_data_item(&local_a0,0,"type","GM");
        std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                  (&p_out->m_data,&local_a0);
        midi_meta_data_item::~midi_meta_data_item(&local_a0);
      }
      midi_meta_data::append(p_out,&this->m_extra_meta_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::string::~string((string *)&convert);
      return;
    }
    if (uVar9 == subsong || this->m_form != 2) {
      uVar10 = 0;
      p_subsong = 0;
      if (this->m_form == 2) {
        p_subsong = uVar9;
      }
      pmVar8 = pmVar8 + uVar9;
      while( true ) {
        lVar1 = *(long *)&(pmVar8->m_events).
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pmVar8->m_events).
                                   super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                   _M_impl + 8) - lVar1 >> 6) <= (ulong)uVar10) break;
        lVar5 = (ulong)uVar10 * 0x40;
        if (*(int *)(lVar1 + 8 + lVar5) != 7) goto switchD_001056d0_caseD_5;
        this_00 = (midi_event *)(lVar1 + lVar5);
        puVar7 = (this_00->m_ext_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                 (this_00->m_data_count -
                 (long)(this_00->m_ext_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        if ((bool)(this_00->m_data[0] != 0xf0 | puVar7 == (pointer)0x0 | bVar2)) {
          if ((this_00->m_data[0] == 0xff && (pointer)0x1 < puVar7) && (this_00->m_data[1] - 1 < 6))
          {
            puVar7 = puVar7 + -2;
            switch((uint)this_00->m_data[1]) {
            case 1:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&data,(size_type)puVar7);
              midi_event::copy_data
                        (this_00,data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,2,(unsigned_long)puVar7);
              std::__cxx11::string::assign<char_const*,void>
                        ((string *)&convert,
                         (char *)data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                         (char *)(data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)puVar7));
              snprintf(temp,0x1f,"track_text_%02lu",uVar9);
              uVar6 = timestamp_to_ms(this,this_00->m_timestamp,p_subsong);
              midi_meta_data_item::midi_meta_data_item
                        (&local_a0,uVar6,temp,convert._M_dataplus._M_p);
              std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                        (&p_out->m_data,&local_a0);
              break;
            case 2:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&data,(size_type)puVar7);
              midi_event::copy_data
                        (this_00,data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,2,(unsigned_long)puVar7);
              std::__cxx11::string::assign<char_const*,void>
                        ((string *)&convert,
                         (char *)data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                         (char *)(data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)puVar7));
              uVar6 = timestamp_to_ms(this,this_00->m_timestamp,p_subsong);
              midi_meta_data_item::midi_meta_data_item
                        (&local_a0,uVar6,"copyright",convert._M_dataplus._M_p);
              std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                        (&p_out->m_data,&local_a0);
              break;
            default:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&data,(size_type)puVar7);
              midi_event::copy_data
                        (this_00,data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,2,(unsigned_long)puVar7);
              std::__cxx11::string::assign<char_const*,void>
                        ((string *)&convert,
                         (char *)data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                         (char *)(data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)puVar7));
              snprintf(temp,0x1f,"track_name_%02lu",uVar9);
              uVar6 = timestamp_to_ms(this,this_00->m_timestamp,p_subsong);
              midi_meta_data_item::midi_meta_data_item
                        (&local_a0,uVar6,temp,convert._M_dataplus._M_p);
              std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                        (&p_out->m_data,&local_a0);
              break;
            case 5:
              goto switchD_001056d0_caseD_5;
            case 6:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&data,(size_type)puVar7);
              midi_event::copy_data
                        (this_00,data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,2,(unsigned_long)puVar7);
              std::__cxx11::string::assign<char_const*,void>
                        ((string *)&convert,
                         (char *)data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                         (char *)(data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)puVar7));
              uVar6 = timestamp_to_ms(this,this_00->m_timestamp,p_subsong);
              midi_meta_data_item::midi_meta_data_item
                        (&local_a0,uVar6,"track_marker",convert._M_dataplus._M_p);
              std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                        (&p_out->m_data,&local_a0);
            }
            midi_meta_data_item::~midi_meta_data_item(&local_a0);
          }
        }
        else {
          uVar3 = this_00->m_data[1];
          if (puVar7 < (pointer)0x2) {
            uVar3 = '\0';
          }
          if (uVar3 == 'A') {
            uVar3 = this_00->m_data[3];
            if (puVar7 < (pointer)0x4) {
              uVar3 = '\0';
            }
            if (uVar3 == '\x14') {
              p_value = "D-50";
            }
            else {
              p_value = "GS";
              if (uVar3 != 'B') {
                if (uVar3 != '\x16') goto switchD_001056d0_caseD_5;
                p_value = "MT-32";
              }
            }
LAB_0010579d:
            uVar6 = timestamp_to_ms(this,this_00->m_timestamp,p_subsong);
            midi_meta_data_item::midi_meta_data_item(&local_a0,uVar6,"type",p_value);
            std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                      (&p_out->m_data,&local_a0);
            midi_meta_data_item::~midi_meta_data_item(&local_a0);
            bVar2 = true;
          }
          else {
            if (uVar3 == 'B') {
              p_value = "X5";
              goto LAB_0010579d;
            }
            p_value = "XG";
            if (uVar3 == 'C') goto LAB_0010579d;
            if (uVar3 != '~') goto switchD_001056d0_caseD_5;
          }
          bVar4 = true;
        }
switchD_001056d0_caseD_5:
        uVar10 = uVar10 + 1;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void midi_container::get_meta_data( unsigned long subsong, midi_meta_data & p_out )
{
    char temp[32];
    std::string convert;

    std::vector<uint8_t> data;

    bool type_found = false;
    bool type_non_gm_found = false;

    for ( unsigned long i = 0; i < m_tracks.size(); ++i )
    {
        if ( m_form == 2 && i != subsong ) continue;

        unsigned long tempo_track = 0;
        if ( m_form == 2 ) tempo_track = i;

        const midi_track & track = m_tracks[ i ];
        for ( unsigned j = 0; j < track.get_count(); ++j )
        {
            const midi_event & event = track[ j ];
            if ( event.m_type == midi_event::extended )
            {
                std::size_t data_count = event.get_data_count();
                if ( !type_non_gm_found && data_count >= 1 && event.m_data[ 0 ] == 0xF0 )
                {
                    unsigned char test = 0;
                    unsigned char test2 = 0;
                    if ( data_count > 1 ) test  = event.m_data[ 1 ];
                    if ( data_count > 3 ) test2 = event.m_data[ 3 ];

                    const char * type = NULL;

                    switch( test )
                    {
                    case 0x7E:
                        type_found = true;
                        break;
                    case 0x43:
                        type = "XG";
                        break;
                    case 0x42:
                        type = "X5";
                        break;
                    case 0x41:
                        if ( test2 == 0x42 ) type = "GS";
                        else if ( test2 == 0x16 ) type = "MT-32";
                        else if ( test2 == 0x14 ) type = "D-50";
                    }

                    if ( type )
                    {
                        type_found = true;
                        type_non_gm_found = true;
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "type", type ) );
                    }
                }
                else if ( data_count >= 2 && event.m_data[ 0 ] == 0xFF )
                {
                    data_count -= 2;
                    switch ( event.m_data[ 1 ] )
                    {
                    case 6:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "track_marker", convert.c_str() ) );
                        break;

                    case 2:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "copyright", convert.c_str() ) );
                        break;

                    case 1:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        snprintf(temp, 31, "track_text_%02lu", i);
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), temp, convert.c_str() ) );
                        break;

                    case 3:
                    case 4:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        snprintf(temp, 31, "track_name_%02lu", i);
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), temp, convert.c_str() ) );
                        break;
                    }
                }
            }
        }
    }

    if ( type_found && !type_non_gm_found )
    {
        p_out.add_item( midi_meta_data_item( 0, "type", "GM" ) );
    }

    p_out.append( m_extra_meta_data );
}